

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu.c
# Opt level: O1

void ppu_hblank(gba_ppu_t *ppu)

{
  ushort uVar1;
  uint16_t uVar2;
  ushort uVar3;
  int iVar4;
  undefined4 uVar5;
  long lVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  byte bVar11;
  uint uVar12;
  gba_ppu_t *pgVar13;
  ushort uVar14;
  ulong uVar15;
  DISPCNT_t *pDVar16;
  byte bVar17;
  ushort uVar18;
  int x_1;
  int iVar19;
  uint uVar20;
  uint uVar21;
  int x;
  uint uVar22;
  ulong uVar23;
  bool bVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar44 [16];
  undefined1 auVar48 [16];
  _Bool bg_enabled [4];
  _Bool bg_top [6];
  bg_rotation_scaling_t *in_stack_ffffffffffffff38;
  bg_rotation_scaling_t *in_stack_ffffffffffffff48;
  ushort local_a0;
  byte local_9c [4];
  gba_ppu_t *local_98;
  uint local_8c;
  byte local_86 [4];
  byte local_82;
  byte local_81;
  byte local_80 [4];
  byte local_7c;
  byte local_7b;
  ushort local_7a;
  undefined8 local_78;
  undefined8 local_70;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  DISPCNT_t *local_50;
  uint local_44;
  color_t (*local_40) [240];
  ulong local_38;
  undefined1 auVar30 [16];
  undefined1 auVar35 [16];
  undefined1 auVar27 [16];
  undefined1 auVar31 [16];
  undefined1 auVar36 [16];
  undefined1 auVar41 [16];
  undefined1 auVar45 [16];
  undefined1 auVar49 [16];
  undefined1 auVar42 [16];
  undefined1 auVar46 [16];
  undefined1 auVar50 [16];
  undefined1 auVar43 [16];
  undefined1 auVar47 [16];
  undefined1 auVar51 [16];
  short sVar52;
  short sVar53;
  short sVar54;
  
  if (ppu->y < 0xa1 || ppu->y == 0xe3) {
    dma_start_trigger(HBlank);
  }
  if (((uint)ppu->DISPSTAT & 0x10) != 0) {
    request_interrupt(IRQ_HBLANK);
  }
  *(byte *)&ppu->DISPSTAT = *(byte *)&ppu->DISPSTAT | 2;
  if ((ppu->y < 0xa0) && (uVar14 = (ppu->DISPCNT).raw, -1 < (char)uVar14)) {
    local_50 = &ppu->DISPCNT;
    switch(uVar14 & 7) {
    case 0:
      local_98 = ppu;
      if ((uVar14 >> 0xc & 1) != 0) {
        render_obj(ppu);
      }
      if (((uint)*local_50 & 0x100) != 0) {
        uVar2 = (ppu->BG0HOFS).raw;
        uVar14 = (ppu->WININ).raw;
        uVar10 = (uint)(uVar14 >> 8);
        local_70 = (gba_color_t (*) [240])(CONCAT44(local_70._4_4_,uVar10) & 0xffffffff00000001);
        uVar18 = (ppu->WINOUT).raw;
        uVar1 = ppu->y;
        uVar8 = (uint)(ppu->BG0VOFS).raw + (uint)uVar1;
        local_78 = CONCAT44(local_78._4_4_,uVar8 >> 7) & 0xffffffff00000002;
        uVar23 = 0;
        do {
          if ((byte)(ppu->WIN0H).raw < uVar23 || uVar23 < (ppu->WIN0H).raw >> 8) {
            bVar24 = false;
          }
          else {
            bVar24 = uVar1 <= ((ppu->WIN0V).raw & 0xff) && (ppu->WIN0V).raw >> 8 <= uVar1;
          }
          if ((byte)(ppu->WIN1H).raw < uVar23 || uVar23 < (ppu->WIN1H).raw >> 8) {
            bVar7 = false;
          }
          else {
            bVar7 = uVar1 <= ((ppu->WIN1V).raw & 0xff) && (ppu->WIN1V).raw >> 8 <= uVar1;
          }
          uVar3 = (ppu->DISPCNT).raw;
          bVar11 = (byte)(uVar3 >> 8);
          uVar9 = (uint)uVar14;
          if ((((bVar11 >> 5 & 1 & bVar24) == 0) &&
              (uVar9 = uVar10 & 1, (bVar11 >> 6 & 1 & bVar7) == 0)) &&
             ((-1 < (short)uVar3 || (uVar9 = uVar18 >> 8 & 1, ppu->obj_window[uVar23] == false)))) {
            local_a0._0_1_ = (byte)uVar18;
            uVar9 = (uint)(byte)(bVar24 | bVar7 | (byte)local_a0 | (uVar3 & 0x6000) == 0);
          }
          if ((uVar9 & 1) != 0) {
            (*(code *)(&DAT_00129534 +
                      *(int *)(&DAT_00129534 + (ulong)((ppu->BG0CNT).raw >> 0xe) * 4)))
                      ((uVar8 & 7) << 3,uVar2,&DAT_00129534,
                       &DAT_00129534 +
                       *(int *)(&DAT_00129534 + (ulong)((ppu->BG0CNT).raw >> 0xe) * 4));
            return;
          }
          ppu->bgbuf[0][uVar23].raw = *(ushort *)ppu->pram | 0x8000;
          uVar23 = uVar23 + 1;
        } while (uVar23 != 0xf0);
      }
      if (((uint)*local_50 & 0x200) != 0) {
        uVar2 = (ppu->BG1HOFS).raw;
        uVar14 = (ppu->WININ).raw;
        local_70 = (gba_color_t (*) [240])
                   (CONCAT44(local_70._4_4_,(uint)(uVar14 >> 9)) & 0xffffffff00000001);
        uVar18 = (ppu->WINOUT).raw;
        uVar1 = ppu->y;
        uVar8 = (uint)(ppu->BG1VOFS).raw + (uint)uVar1;
        local_8c = uVar8 >> 8 & 1;
        uVar15 = 0;
        uVar10 = (uVar18 & 2) >> 1;
        local_78 = CONCAT44(local_78._4_4_,uVar10);
        uVar23 = local_78;
        do {
          if ((byte)(ppu->WIN0H).raw < uVar15 || uVar15 < (ppu->WIN0H).raw >> 8) {
            bVar24 = false;
          }
          else {
            bVar24 = uVar1 <= ((ppu->WIN0V).raw & 0xff) && (ppu->WIN0V).raw >> 8 <= uVar1;
          }
          if ((byte)(ppu->WIN1H).raw < uVar15 || uVar15 < (ppu->WIN1H).raw >> 8) {
            bVar7 = false;
          }
          else {
            bVar7 = uVar1 <= ((ppu->WIN1V).raw & 0xff) && (ppu->WIN1V).raw >> 8 <= uVar1;
          }
          uVar3 = (ppu->DISPCNT).raw;
          bVar11 = (byte)(uVar3 >> 8);
          uVar9 = (uVar14 & 2) >> 1;
          if ((((bVar11 >> 5 & 1 & bVar24) == 0) &&
              (uVar9 = (uint)local_70, (bVar11 >> 6 & 1 & bVar7) == 0)) &&
             ((-1 < (short)uVar3 || (uVar9 = uVar18 >> 9 & 1, local_98->obj_window[uVar15] == false)
              ))) {
            local_78._0_1_ = (byte)uVar10;
            uVar9 = (uint)(byte)(bVar24 | bVar7 | (byte)local_78 | (uVar3 & 0x6000) == 0);
          }
          local_78 = uVar23;
          if (uVar9 != 0) {
            (*(code *)(&DAT_00129544 +
                      *(int *)(&DAT_00129544 + (ulong)((local_98->BG1CNT).raw >> 0xe) * 4)))
                      ((uVar8 & 7) << 3,uVar2,&DAT_00129544,
                       &DAT_00129544 +
                       *(int *)(&DAT_00129544 + (ulong)((local_98->BG1CNT).raw >> 0xe) * 4));
            return;
          }
          local_98->bgbuf[1][uVar15].raw = *(ushort *)local_98->pram | 0x8000;
          uVar15 = uVar15 + 1;
          ppu = local_98;
        } while (uVar15 != 0xf0);
      }
      if (((uint)*local_50 & 0x400) != 0) {
        uVar2 = (ppu->BG2HOFS).raw;
        uVar14 = (ppu->WININ).raw;
        local_70 = (gba_color_t (*) [240])
                   (CONCAT44(local_70._4_4_,(uint)(uVar14 >> 10)) & 0xffffffff00000001);
        uVar18 = (ppu->WINOUT).raw;
        uVar1 = ppu->y;
        uVar8 = (uint)(ppu->BG2VOFS).raw + (uint)uVar1;
        local_8c = uVar8 >> 8 & 1;
        uVar15 = 0;
        uVar10 = (uVar18 & 4) >> 2;
        local_78 = CONCAT44(local_78._4_4_,uVar10);
        uVar23 = local_78;
        do {
          if ((byte)(ppu->WIN0H).raw < uVar15 || uVar15 < (ppu->WIN0H).raw >> 8) {
            bVar24 = false;
          }
          else {
            bVar24 = uVar1 <= ((ppu->WIN0V).raw & 0xff) && (ppu->WIN0V).raw >> 8 <= uVar1;
          }
          if ((byte)(ppu->WIN1H).raw < uVar15 || uVar15 < (ppu->WIN1H).raw >> 8) {
            bVar7 = false;
          }
          else {
            bVar7 = uVar1 <= ((ppu->WIN1V).raw & 0xff) && (ppu->WIN1V).raw >> 8 <= uVar1;
          }
          uVar3 = (ppu->DISPCNT).raw;
          bVar11 = (byte)(uVar3 >> 8);
          uVar9 = (uVar14 & 4) >> 2;
          if ((((bVar11 >> 5 & 1 & bVar24) == 0) &&
              (uVar9 = (uint)local_70, (bVar11 >> 6 & 1 & bVar7) == 0)) &&
             ((-1 < (short)uVar3 ||
              (uVar9 = uVar18 >> 10 & 1, local_98->obj_window[uVar15] == false)))) {
            local_78._0_1_ = (byte)uVar10;
            uVar9 = (uint)(byte)(bVar24 | bVar7 | (byte)local_78 | (uVar3 & 0x6000) == 0);
          }
          local_78 = uVar23;
          if (uVar9 != 0) {
            (*(code *)(&DAT_00129554 +
                      *(int *)(&DAT_00129554 + (ulong)((local_98->BG2CNT).raw >> 0xe) * 4)))
                      ((uVar8 & 7) << 3,uVar2,&DAT_00129554,
                       &DAT_00129554 +
                       *(int *)(&DAT_00129554 + (ulong)((local_98->BG2CNT).raw >> 0xe) * 4));
            return;
          }
          local_98->bgbuf[2][uVar15].raw = *(ushort *)local_98->pram | 0x8000;
          uVar15 = uVar15 + 1;
          ppu = local_98;
        } while (uVar15 != 0xf0);
      }
      if (((uint)*local_50 & 0x800) != 0) {
        uVar2 = (ppu->BG3HOFS).raw;
        uVar14 = (ppu->WININ).raw;
        local_70 = (gba_color_t (*) [240])
                   (CONCAT44(local_70._4_4_,(uint)(uVar14 >> 0xb)) & 0xffffffff00000001);
        uVar18 = (ppu->WINOUT).raw;
        uVar1 = ppu->y;
        uVar8 = (uint)(ppu->BG3VOFS).raw + (uint)uVar1;
        local_8c = uVar8 >> 8 & 1;
        uVar15 = 0;
        uVar10 = (uVar18 & 8) >> 3;
        local_78 = CONCAT44(local_78._4_4_,uVar10);
        uVar23 = local_78;
        do {
          if ((byte)(ppu->WIN0H).raw < uVar15 || uVar15 < (ppu->WIN0H).raw >> 8) {
            bVar24 = false;
          }
          else {
            bVar24 = uVar1 <= ((ppu->WIN0V).raw & 0xff) && (ppu->WIN0V).raw >> 8 <= uVar1;
          }
          if ((byte)(ppu->WIN1H).raw < uVar15 || uVar15 < (ppu->WIN1H).raw >> 8) {
            bVar7 = false;
          }
          else {
            bVar7 = uVar1 <= ((ppu->WIN1V).raw & 0xff) && (ppu->WIN1V).raw >> 8 <= uVar1;
          }
          uVar3 = (ppu->DISPCNT).raw;
          bVar11 = (byte)(uVar3 >> 8);
          uVar9 = (uVar14 & 8) >> 3;
          if ((((bVar11 >> 5 & 1 & bVar24) == 0) &&
              (uVar9 = (uint)local_70, (bVar11 >> 6 & 1 & bVar7) == 0)) &&
             ((-1 < (short)uVar3 ||
              (uVar9 = uVar18 >> 0xb & 1, local_98->obj_window[uVar15] == false)))) {
            local_78._0_1_ = (byte)uVar10;
            uVar9 = (uint)(byte)(bVar24 | bVar7 | (byte)local_78 | (uVar3 & 0x6000) == 0);
          }
          local_78 = uVar23;
          if (uVar9 != 0) {
            (*(code *)(&DAT_00129564 +
                      *(int *)(&DAT_00129564 + (ulong)((local_98->BG3CNT).raw >> 0xe) * 4)))
                      ((uVar8 & 7) << 3,uVar2,&DAT_00129564,
                       &DAT_00129564 +
                       *(int *)(&DAT_00129564 + (ulong)((local_98->BG3CNT).raw >> 0xe) * 4));
            return;
          }
          local_98->bgbuf[3][uVar15].raw = *(ushort *)local_98->pram | 0x8000;
          uVar15 = uVar15 + 1;
          ppu = local_98;
        } while (uVar15 != 0xf0);
      }
      uVar23 = 0;
      dbg_line_drawn();
      refresh_background_priorities(ppu);
      uVar10 = (ppu->BLDALPHA).raw & 0x1f;
      if (0xf < (ushort)uVar10) {
        uVar10 = 0x10;
      }
      uVar8 = (ppu->BLDALPHA).raw >> 8 & 0x1f;
      if (0xf < (ushort)uVar8) {
        uVar8 = 0x10;
      }
      local_44 = (ppu->BLDY).raw & 0x1f;
      if (0xf < (ushort)local_44) {
        local_44 = 0x10;
      }
      bVar11 = (byte)((ppu->DISPCNT).raw >> 8);
      local_9c[0] = bVar11 & 1;
      local_9c[1] = bVar11 >> 1 & 1;
      local_9c[2] = bVar11 >> 2 & 1;
      local_9c[3] = bVar11 >> 3 & 1;
      bVar11 = (byte)(ppu->BLDCNT).raw;
      local_80[0] = bVar11 & 1;
      local_80[1] = bVar11 >> 1 & 1;
      local_80[2] = bVar11 >> 2 & 1;
      local_80[3] = bVar11 >> 3 & 1;
      local_7c = bVar11 >> 4 & 1;
      local_7b = bVar11 >> 5 & 1;
      bVar11 = (byte)((ppu->BLDCNT).raw >> 8);
      local_86[0] = bVar11 & 1;
      local_86[1] = bVar11 >> 1 & 1;
      local_86[2] = bVar11 >> 2 & 1;
      local_86[3] = bVar11 >> 3 & 1;
      local_82 = bVar11 >> 4 & 1;
      local_81 = bVar11 >> 5 & 1;
      local_7a = *(ushort *)ppu->pram;
      local_38 = (ulong)ppu->y;
      local_70 = ppu->bgbuf;
      local_40 = ppu->screen;
      pgVar13 = ppu;
      uVar15 = local_38;
      do {
        uVar14 = (ushort)uVar15;
        if ((byte)(pgVar13->WIN0H).raw < uVar23 || uVar23 < (pgVar13->WIN0H).raw >> 8) {
          bVar24 = false;
        }
        else {
          bVar24 = uVar14 <= ((pgVar13->WIN0V).raw & 0xff) && (pgVar13->WIN0V).raw >> 8 <= uVar14;
        }
        if ((byte)(pgVar13->WIN1H).raw < uVar23 || uVar23 < (pgVar13->WIN1H).raw >> 8) {
          bVar7 = false;
        }
        else {
          bVar7 = uVar14 <= ((pgVar13->WIN1V).raw & 0xff) && (pgVar13->WIN1V).raw >> 8 <= uVar14;
        }
        uVar14 = local_50->raw;
        bVar11 = (byte)(uVar14 >> 8);
        if ((bVar11 >> 5 & 1 & bVar24) == 1) {
          bVar11 = *(byte *)&pgVar13->WININ;
LAB_0011b305:
          uVar18 = (ushort)(bVar11 >> 5);
        }
        else {
          if ((bVar11 >> 6 & 1 & bVar7) == 1) {
            uVar18 = (pgVar13->WININ).raw;
          }
          else {
            if (((short)uVar14 < 0 & pgVar13->obj_window[uVar23]) != 1) {
              uVar18 = 1;
              if ((uVar14 & 0x6000) != 0 && (bVar24 == false && bVar7 == false)) {
                bVar11 = *(byte *)&pgVar13->WINOUT;
                goto LAB_0011b305;
              }
              goto LAB_0011b34b;
            }
            uVar18 = (pgVar13->WINOUT).raw;
          }
          uVar18 = uVar18 >> 0xd;
        }
LAB_0011b34b:
        uVar14 = (pgVar13->BLDCNT).raw;
        local_8c = uVar14 >> 6 & 3;
        local_a0 = uVar14 & 0xc0;
        local_58 = (black.raw & 0x1f) * local_44;
        local_5c = (black.raw >> 5 & 0x1f) * local_44;
        local_54 = (black.raw >> 10 & 0x1f) * local_44;
        local_64 = (white.raw & 0x1f) * local_44;
        local_68 = (white.raw >> 5 & 0x1f) * local_44;
        local_60 = (white.raw >> 10 & 0x1f) * local_44;
        iVar19 = 5;
        uVar15 = 3;
        local_78 = (ulong)local_8c;
        uVar20 = (uint)local_7a;
        uVar9 = uVar20;
        do {
          iVar4 = background_priorities[uVar15];
          lVar6 = (long)iVar19;
          if ((uVar18 & 1) == 0) {
            bVar11 = 0;
          }
          else {
            bVar11 = (local_a0 == 0x40 & local_86[lVar6] | (char)uVar14 < '\0') & local_80[iVar4];
          }
          uVar1 = ppu->bgbuf[iVar4][uVar23].raw;
          uVar12 = (uint)uVar1;
          bVar17 = -1 < (short)uVar1 & local_9c[iVar4];
          uVar21 = (uint)(byte)(0x10 - (char)local_44);
          if ((bVar17 == 1) && (bVar11 != 0)) {
            switch(local_8c) {
            case 0:
              goto switchD_0011b48e_caseD_11ce62;
            case 1:
              uVar9 = (uVar12 & 0x1f) * uVar10 + (uVar20 & 0x1f) * uVar8 >> 4;
              if (0x1e < uVar9) {
                uVar9 = 0x1f;
              }
              uVar12 = (uVar1 >> 5 & 0x1f) * uVar10 + (uVar20 >> 5 & 0x1f) * uVar8 >> 4;
              if (0x1e < uVar12) {
                uVar12 = 0x1f;
              }
              uVar20 = (uVar1 >> 10) * uVar10 + (uVar20 >> 10 & 0x1f) * uVar8;
              break;
            case 2:
              uVar9 = (uVar12 & 0x1f) * uVar21 + local_64 >> 4;
              if (0x1e < uVar9) {
                uVar9 = 0x1f;
              }
              uVar12 = (uVar1 >> 5 & 0x1f) * uVar21 + local_68 >> 4;
              if (0x1e < uVar12) {
                uVar12 = 0x1f;
              }
              uVar20 = (uVar1 >> 10) * uVar21 + local_60;
              break;
            case 3:
              uVar9 = (uVar12 & 0x1f) * uVar21 + local_58 >> 4;
              if (0x1e < uVar9) {
                uVar9 = 0x1f;
              }
              uVar12 = (uVar1 >> 5 & 0x1f) * uVar21 + local_5c >> 4;
              if (0x1e < uVar12) {
                uVar12 = 0x1f;
              }
              uVar20 = (uVar1 >> 10) * uVar21 + local_54;
            }
            uVar20 = uVar20 >> 4;
            if (0x1e < uVar20) {
              uVar20 = 0x1f;
            }
            uVar20 = uVar9 | uVar20 << 10 | uVar12 << 5;
LAB_0011b5d0:
            uVar9 = uVar20;
            uVar12 = (uint)uVar1;
            iVar19 = iVar4;
          }
          else {
            uVar12 = uVar20;
            uVar20 = (uint)uVar1;
            if (bVar17 != 0) goto LAB_0011b5d0;
          }
          uVar20 = uVar12;
          if (uVar15 == local_98->obj_priorities[uVar23]) {
            uVar1 = local_98->objbuf[uVar23].raw;
            bVar24 = -1 < (short)uVar1;
            uVar22 = (uint)uVar1;
            if (bVar24) {
              uVar9 = uVar22;
            }
            if (bVar24) {
              uVar20 = uVar22;
              iVar19 = 4;
            }
            if ((byte)(bVar24 & pgVar13->obj_alpha[uVar23] & ((char)uVar14 < '\0' | local_86[lVar6])
                      ) != 1) goto LAB_0011b79b;
            switch(local_8c) {
            case 0:
              goto switchD_0011b642_caseD_11ce71;
            default:
              uVar9 = (uVar1 & 0x1f) * uVar10 + (uVar12 & 0x1f) * uVar8 >> 4;
              if (0x1e < uVar9) {
                uVar9 = 0x1f;
              }
              uVar20 = (uVar1 >> 5 & 0x1f) * uVar10 + (uVar12 >> 5 & 0x1f) * uVar8 >> 4;
              if (0x1e < uVar20) {
                uVar20 = 0x1f;
              }
              uVar21 = (uVar1 >> 10) * uVar10 + (uVar12 >> 10 & 0x1f) * uVar8 >> 4;
              if (0x1e < uVar21) {
                uVar21 = 0x1f;
              }
              uVar9 = uVar9 | uVar21 << 10;
              goto LAB_0011b793;
            case 2:
              uVar9 = (uVar1 & 0x1f) * uVar21 + local_64 >> 4;
              if (0x1e < uVar9) {
                uVar9 = 0x1f;
              }
              uVar20 = (uVar1 >> 5 & 0x1f) * uVar21 + local_68 >> 4;
              if (0x1e < uVar20) {
                uVar20 = 0x1f;
              }
              uVar21 = (uVar1 >> 10) * uVar21 + local_60;
              break;
            case 3:
              uVar9 = (uVar22 & 0x1f) * uVar21 + local_58 >> 4;
              if (0x1e < uVar9) {
                uVar9 = 0x1f;
              }
              uVar20 = (uVar1 >> 5 & 0x1f) * uVar21 + local_5c >> 4;
              if (0x1e < uVar20) {
                uVar20 = 0x1f;
              }
              uVar21 = (uVar1 >> 10) * uVar21 + local_54;
            }
            uVar21 = uVar21 >> 4;
            if (0x1e < uVar21) {
              uVar21 = 0x1f;
            }
            uVar9 = uVar9 | uVar21 << 10;
LAB_0011b793:
            uVar9 = uVar9 | uVar20 << 5;
            iVar19 = 4;
            uVar20 = (uint)uVar1;
          }
LAB_0011b79b:
          bVar24 = uVar15 != 0;
          uVar15 = uVar15 - 1;
        } while (bVar24);
        local_40[local_38][uVar23].a = 0xff;
        local_40[local_38][uVar23].r = ((byte)uVar9 & 7) + (byte)uVar9 * '\b';
        bVar11 = (byte)((uVar9 & 0xffff) >> 5);
        local_40[local_38][uVar23].g = (bVar11 & 7) + bVar11 * '\b';
        bVar11 = (byte)((uVar9 & 0xffff) >> 10);
        local_40[local_38][uVar23].b = (bVar11 & 7) + bVar11 * '\b';
        uVar23 = uVar23 + 1;
        pgVar13 = local_98;
        uVar15 = local_38;
      } while (uVar23 != 0xf0);
      break;
    case 1:
      local_98 = ppu;
      if ((uVar14 >> 0xc & 1) != 0) {
        render_obj(ppu);
      }
      pgVar13 = local_98;
      if (((uint)*local_50 & 0x100) != 0) {
        uVar2 = (ppu->BG0HOFS).raw;
        uVar14 = (ppu->WININ).raw;
        uVar10 = (uint)(uVar14 >> 8);
        local_70 = (gba_color_t (*) [240])(CONCAT44(local_70._4_4_,uVar10) & 0xffffffff00000001);
        uVar18 = (ppu->WINOUT).raw;
        uVar1 = ppu->y;
        uVar8 = (uint)(ppu->BG0VOFS).raw + (uint)uVar1;
        local_78 = CONCAT44(local_78._4_4_,uVar8 >> 7) & 0xffffffff00000002;
        uVar23 = 0;
        do {
          if ((byte)(ppu->WIN0H).raw < uVar23 || uVar23 < (ppu->WIN0H).raw >> 8) {
            bVar24 = false;
          }
          else {
            bVar24 = uVar1 <= ((ppu->WIN0V).raw & 0xff) && (ppu->WIN0V).raw >> 8 <= uVar1;
          }
          if ((byte)(ppu->WIN1H).raw < uVar23 || uVar23 < (ppu->WIN1H).raw >> 8) {
            bVar7 = false;
          }
          else {
            bVar7 = uVar1 <= ((ppu->WIN1V).raw & 0xff) && (ppu->WIN1V).raw >> 8 <= uVar1;
          }
          uVar3 = (ppu->DISPCNT).raw;
          bVar11 = (byte)(uVar3 >> 8);
          uVar9 = (uint)uVar14;
          if ((((bVar11 >> 5 & 1 & bVar24) == 0) &&
              (uVar9 = uVar10 & 1, (bVar11 >> 6 & 1 & bVar7) == 0)) &&
             ((-1 < (short)uVar3 || (uVar9 = uVar18 >> 8 & 1, ppu->obj_window[uVar23] == false)))) {
            local_a0._0_1_ = (byte)uVar18;
            uVar9 = (uint)(byte)(bVar24 | bVar7 | (byte)local_a0 | (uVar3 & 0x6000) == 0);
          }
          if ((uVar9 & 1) != 0) {
            (*(code *)(&DAT_001294f4 +
                      *(int *)(&DAT_001294f4 + (ulong)((ppu->BG0CNT).raw >> 0xe) * 4)))
                      ((uVar8 & 7) << 3,uVar2,&DAT_001294f4,
                       &DAT_001294f4 +
                       *(int *)(&DAT_001294f4 + (ulong)((ppu->BG0CNT).raw >> 0xe) * 4));
            return;
          }
          ppu->bgbuf[0][uVar23].raw = *(ushort *)ppu->pram | 0x8000;
          uVar23 = uVar23 + 1;
        } while (uVar23 != 0xf0);
      }
      if (((uint)*local_50 & 0x200) != 0) {
        uVar2 = (ppu->BG1HOFS).raw;
        uVar14 = (ppu->WININ).raw;
        local_70 = (gba_color_t (*) [240])
                   (CONCAT44(local_70._4_4_,(uint)(uVar14 >> 9)) & 0xffffffff00000001);
        uVar18 = (ppu->WINOUT).raw;
        uVar1 = ppu->y;
        uVar8 = (uint)(ppu->BG1VOFS).raw + (uint)uVar1;
        local_8c = uVar8 >> 8 & 1;
        uVar15 = 0;
        uVar10 = (uVar18 & 2) >> 1;
        local_78 = CONCAT44(local_78._4_4_,uVar10);
        uVar23 = local_78;
        do {
          if ((byte)(ppu->WIN0H).raw < uVar15 || uVar15 < (ppu->WIN0H).raw >> 8) {
            bVar24 = false;
          }
          else {
            bVar24 = uVar1 <= ((ppu->WIN0V).raw & 0xff) && (ppu->WIN0V).raw >> 8 <= uVar1;
          }
          if ((byte)(ppu->WIN1H).raw < uVar15 || uVar15 < (ppu->WIN1H).raw >> 8) {
            bVar7 = false;
          }
          else {
            bVar7 = uVar1 <= ((ppu->WIN1V).raw & 0xff) && (ppu->WIN1V).raw >> 8 <= uVar1;
          }
          uVar3 = (ppu->DISPCNT).raw;
          bVar11 = (byte)(uVar3 >> 8);
          uVar9 = (uVar14 & 2) >> 1;
          if ((((bVar11 >> 5 & 1 & bVar24) == 0) &&
              (uVar9 = (uint)local_70, (bVar11 >> 6 & 1 & bVar7) == 0)) &&
             ((-1 < (short)uVar3 || (uVar9 = uVar18 >> 9 & 1, local_98->obj_window[uVar15] == false)
              ))) {
            local_78._0_1_ = (byte)uVar10;
            uVar9 = (uint)(byte)(bVar24 | bVar7 | (byte)local_78 | (uVar3 & 0x6000) == 0);
          }
          local_78 = uVar23;
          if (uVar9 != 0) {
            (*(code *)(&DAT_00129504 +
                      *(int *)(&DAT_00129504 + (ulong)((local_98->BG1CNT).raw >> 0xe) * 4)))
                      ((uVar8 & 7) << 3,uVar2,&DAT_00129504,
                       &DAT_00129504 +
                       *(int *)(&DAT_00129504 + (ulong)((local_98->BG1CNT).raw >> 0xe) * 4));
            return;
          }
          local_98->bgbuf[1][uVar15].raw = *(ushort *)local_98->pram | 0x8000;
          uVar15 = uVar15 + 1;
          ppu = local_98;
        } while (uVar15 != 0xf0);
      }
      if (((uint)*local_50 & 0x400) != 0) {
        uVar9._0_2_ = ppu->WININ;
        uVar9._2_2_ = ppu->WINOUT;
        auVar25 = pshuflw(ZEXT416(uVar9),ZEXT416(uVar9),5);
        auVar39 = ZEXT816(0x4040000040400);
        sVar54 = auVar39._6_2_;
        auVar51._0_12_ = auVar39._0_12_;
        auVar51._12_2_ = sVar54;
        auVar51._14_2_ = sVar54;
        sVar53 = auVar39._4_2_;
        auVar50._12_4_ = auVar51._12_4_;
        auVar50._0_10_ = auVar39._0_10_;
        auVar50._10_2_ = sVar53;
        auVar49._10_6_ = auVar50._10_6_;
        auVar49._8_2_ = sVar53;
        auVar49._0_8_ = 0x4040000040400;
        sVar52 = auVar39._2_2_;
        auVar48._8_8_ = auVar49._8_8_;
        auVar48._6_2_ = sVar52;
        auVar48._4_2_ = sVar52;
        auVar48._0_2_ = auVar39._0_2_;
        auVar48._2_2_ = auVar48._0_2_;
        auVar36._0_12_ = auVar25._0_12_;
        auVar36._12_2_ = auVar25._6_2_;
        auVar36._14_2_ = auVar25._6_2_;
        auVar35._12_4_ = auVar36._12_4_;
        auVar35._0_10_ = auVar25._0_10_;
        auVar35._10_2_ = auVar25._4_2_;
        auVar34._10_6_ = auVar35._10_6_;
        auVar34._0_8_ = auVar25._0_8_;
        auVar34._8_2_ = auVar25._4_2_;
        auVar37._8_8_ = auVar34._8_8_;
        auVar37._6_2_ = auVar25._2_2_;
        auVar37._4_2_ = auVar25._2_2_;
        auVar37._0_2_ = auVar25._0_2_;
        auVar37._2_2_ = auVar37._0_2_;
        auVar37 = auVar37 & auVar48;
        auVar38._0_2_ = -(ushort)(auVar37._0_2_ == auVar48._0_2_);
        auVar38._2_2_ = -(ushort)(auVar37._2_2_ == auVar48._0_2_);
        auVar38._4_2_ = -(ushort)(auVar37._4_2_ == sVar52);
        auVar38._6_2_ = -(ushort)(auVar37._6_2_ == sVar52);
        auVar38._8_2_ = -(ushort)(auVar37._8_2_ == sVar53);
        auVar38._10_2_ = -(ushort)(auVar37._10_2_ == sVar53);
        auVar38._12_2_ = -(ushort)(auVar37._12_2_ == sVar54);
        auVar38._14_2_ = -(ushort)(auVar37._14_2_ == sVar54);
        uVar5 = movmskps((int)local_50,auVar38);
        bVar11 = (byte)uVar5;
        render_bg_affine(local_98,ppu->bgbuf + 2,&ppu->BG2CNT,(_Bool)(bVar11 >> 3),
                         (_Bool)((bVar11 & 4) >> 2),(_Bool)((bVar11 & 2) >> 1),(_Bool)(bVar11 & 1),
                         &ppu->BG2X,&ppu->BG2Y,&ppu->BG2PA,in_stack_ffffffffffffff38,
                         &local_98->BG2PC,in_stack_ffffffffffffff48);
        ppu = pgVar13;
      }
      uVar23 = 0;
      dbg_line_drawn();
      refresh_background_priorities(ppu);
      uVar10 = (ppu->BLDALPHA).raw & 0x1f;
      if (0xf < (ushort)uVar10) {
        uVar10 = 0x10;
      }
      uVar8 = (ppu->BLDALPHA).raw >> 8 & 0x1f;
      if (0xf < (ushort)uVar8) {
        uVar8 = 0x10;
      }
      local_44 = (ppu->BLDY).raw & 0x1f;
      if (0xf < (ushort)local_44) {
        local_44 = 0x10;
      }
      bVar11 = (byte)((ppu->DISPCNT).raw >> 8);
      local_9c[0] = bVar11 & 1;
      local_9c[1] = bVar11 >> 1 & 1;
      local_9c[2] = bVar11 >> 2 & 1;
      local_9c[3] = bVar11 >> 3 & 1;
      bVar11 = (byte)(ppu->BLDCNT).raw;
      local_80[0] = bVar11 & 1;
      local_80[1] = bVar11 >> 1 & 1;
      local_80[2] = bVar11 >> 2 & 1;
      local_80[3] = bVar11 >> 3 & 1;
      local_7c = bVar11 >> 4 & 1;
      local_7b = bVar11 >> 5 & 1;
      bVar11 = (byte)((ppu->BLDCNT).raw >> 8);
      local_86[0] = bVar11 & 1;
      local_86[1] = bVar11 >> 1 & 1;
      local_86[2] = bVar11 >> 2 & 1;
      local_86[3] = bVar11 >> 3 & 1;
      local_82 = bVar11 >> 4 & 1;
      local_81 = bVar11 >> 5 & 1;
      local_7a = *(ushort *)ppu->pram;
      local_38 = (ulong)ppu->y;
      local_70 = ppu->bgbuf;
      local_40 = ppu->screen;
      pgVar13 = ppu;
      uVar15 = local_38;
      do {
        uVar14 = (ushort)uVar15;
        if ((byte)(pgVar13->WIN0H).raw < uVar23 || uVar23 < (pgVar13->WIN0H).raw >> 8) {
          bVar24 = false;
        }
        else {
          bVar24 = uVar14 <= ((pgVar13->WIN0V).raw & 0xff) && (pgVar13->WIN0V).raw >> 8 <= uVar14;
        }
        if ((byte)(pgVar13->WIN1H).raw < uVar23 || uVar23 < (pgVar13->WIN1H).raw >> 8) {
          bVar7 = false;
        }
        else {
          bVar7 = uVar14 <= ((pgVar13->WIN1V).raw & 0xff) && (pgVar13->WIN1V).raw >> 8 <= uVar14;
        }
        uVar14 = local_50->raw;
        bVar11 = (byte)(uVar14 >> 8);
        if ((bVar11 >> 5 & 1 & bVar24) == 1) {
          bVar11 = *(byte *)&pgVar13->WININ;
LAB_0011c91e:
          uVar18 = (ushort)(bVar11 >> 5);
        }
        else {
          if ((bVar11 >> 6 & 1 & bVar7) == 1) {
            uVar18 = (pgVar13->WININ).raw;
          }
          else {
            if (((short)uVar14 < 0 & pgVar13->obj_window[uVar23]) != 1) {
              uVar18 = 1;
              if ((uVar14 & 0x6000) != 0 && (bVar24 == false && bVar7 == false)) {
                bVar11 = *(byte *)&pgVar13->WINOUT;
                goto LAB_0011c91e;
              }
              goto LAB_0011c964;
            }
            uVar18 = (pgVar13->WINOUT).raw;
          }
          uVar18 = uVar18 >> 0xd;
        }
LAB_0011c964:
        uVar14 = (pgVar13->BLDCNT).raw;
        local_8c = uVar14 >> 6 & 3;
        local_a0 = uVar14 & 0xc0;
        local_58 = (black.raw & 0x1f) * local_44;
        local_5c = (black.raw >> 5 & 0x1f) * local_44;
        local_54 = (black.raw >> 10 & 0x1f) * local_44;
        local_64 = (white.raw & 0x1f) * local_44;
        local_68 = (white.raw >> 5 & 0x1f) * local_44;
        local_60 = (white.raw >> 10 & 0x1f) * local_44;
        iVar19 = 5;
        uVar15 = 3;
        local_78 = (ulong)local_8c;
        uVar20 = (uint)local_7a;
        uVar9 = uVar20;
        do {
          iVar4 = background_priorities[uVar15];
          lVar6 = (long)iVar19;
          if ((uVar18 & 1) == 0) {
            bVar11 = 0;
          }
          else {
            bVar11 = (local_a0 == 0x40 & local_86[lVar6] | (char)uVar14 < '\0') & local_80[iVar4];
          }
          uVar1 = ppu->bgbuf[iVar4][uVar23].raw;
          uVar12 = (uint)uVar1;
          bVar17 = -1 < (short)uVar1 & local_9c[iVar4];
          uVar21 = (uint)(byte)(0x10 - (char)local_44);
          if ((bVar17 == 1) && (bVar11 != 0)) {
            switch(local_8c) {
            case 0:
              goto switchD_0011caa7_caseD_11ce5d;
            case 1:
              uVar9 = (uVar12 & 0x1f) * uVar10 + (uVar20 & 0x1f) * uVar8 >> 4;
              if (0x1e < uVar9) {
                uVar9 = 0x1f;
              }
              uVar12 = (uVar1 >> 5 & 0x1f) * uVar10 + (uVar20 >> 5 & 0x1f) * uVar8 >> 4;
              if (0x1e < uVar12) {
                uVar12 = 0x1f;
              }
              uVar20 = (uVar1 >> 10) * uVar10 + (uVar20 >> 10 & 0x1f) * uVar8;
              break;
            case 2:
              uVar9 = (uVar12 & 0x1f) * uVar21 + local_64 >> 4;
              if (0x1e < uVar9) {
                uVar9 = 0x1f;
              }
              uVar12 = (uVar1 >> 5 & 0x1f) * uVar21 + local_68 >> 4;
              if (0x1e < uVar12) {
                uVar12 = 0x1f;
              }
              uVar20 = (uVar1 >> 10) * uVar21 + local_60;
              break;
            case 3:
              uVar9 = (uVar12 & 0x1f) * uVar21 + local_58 >> 4;
              if (0x1e < uVar9) {
                uVar9 = 0x1f;
              }
              uVar12 = (uVar1 >> 5 & 0x1f) * uVar21 + local_5c >> 4;
              if (0x1e < uVar12) {
                uVar12 = 0x1f;
              }
              uVar20 = (uVar1 >> 10) * uVar21 + local_54;
            }
            uVar20 = uVar20 >> 4;
            if (0x1e < uVar20) {
              uVar20 = 0x1f;
            }
            uVar20 = uVar9 | uVar20 << 10 | uVar12 << 5;
LAB_0011cbe9:
            uVar9 = uVar20;
            uVar12 = (uint)uVar1;
            iVar19 = iVar4;
          }
          else {
            uVar12 = uVar20;
            uVar20 = (uint)uVar1;
            if (bVar17 != 0) goto LAB_0011cbe9;
          }
          uVar20 = uVar12;
          if (uVar15 == local_98->obj_priorities[uVar23]) {
            uVar1 = local_98->objbuf[uVar23].raw;
            bVar24 = -1 < (short)uVar1;
            uVar22 = (uint)uVar1;
            if (bVar24) {
              uVar9 = uVar22;
            }
            if (bVar24) {
              uVar20 = uVar22;
              iVar19 = 4;
            }
            if ((byte)(bVar24 & pgVar13->obj_alpha[uVar23] & ((char)uVar14 < '\0' | local_86[lVar6])
                      ) != 1) goto LAB_0011cdb4;
            switch(local_8c) {
            case 0:
              goto switchD_0011cc5b_caseD_11ce6c;
            default:
              uVar9 = (uVar1 & 0x1f) * uVar10 + (uVar12 & 0x1f) * uVar8 >> 4;
              if (0x1e < uVar9) {
                uVar9 = 0x1f;
              }
              uVar20 = (uVar1 >> 5 & 0x1f) * uVar10 + (uVar12 >> 5 & 0x1f) * uVar8 >> 4;
              if (0x1e < uVar20) {
                uVar20 = 0x1f;
              }
              uVar21 = (uVar1 >> 10) * uVar10 + (uVar12 >> 10 & 0x1f) * uVar8 >> 4;
              if (0x1e < uVar21) {
                uVar21 = 0x1f;
              }
              uVar9 = uVar9 | uVar21 << 10;
              goto LAB_0011cdac;
            case 2:
              uVar9 = (uVar1 & 0x1f) * uVar21 + local_64 >> 4;
              if (0x1e < uVar9) {
                uVar9 = 0x1f;
              }
              uVar20 = (uVar1 >> 5 & 0x1f) * uVar21 + local_68 >> 4;
              if (0x1e < uVar20) {
                uVar20 = 0x1f;
              }
              uVar21 = (uVar1 >> 10) * uVar21 + local_60;
              break;
            case 3:
              uVar9 = (uVar22 & 0x1f) * uVar21 + local_58 >> 4;
              if (0x1e < uVar9) {
                uVar9 = 0x1f;
              }
              uVar20 = (uVar1 >> 5 & 0x1f) * uVar21 + local_5c >> 4;
              if (0x1e < uVar20) {
                uVar20 = 0x1f;
              }
              uVar21 = (uVar1 >> 10) * uVar21 + local_54;
            }
            uVar21 = uVar21 >> 4;
            if (0x1e < uVar21) {
              uVar21 = 0x1f;
            }
            uVar9 = uVar9 | uVar21 << 10;
LAB_0011cdac:
            uVar9 = uVar9 | uVar20 << 5;
            iVar19 = 4;
            uVar20 = (uint)uVar1;
          }
LAB_0011cdb4:
          bVar24 = uVar15 != 0;
          uVar15 = uVar15 - 1;
        } while (bVar24);
        local_40[local_38][uVar23].a = 0xff;
        local_40[local_38][uVar23].r = ((byte)uVar9 & 7) + (byte)uVar9 * '\b';
        bVar11 = (byte)((uVar9 & 0xffff) >> 5);
        local_40[local_38][uVar23].g = (bVar11 & 7) + bVar11 * '\b';
        bVar11 = (byte)((uVar9 & 0xffff) >> 10);
        local_40[local_38][uVar23].b = (bVar11 & 7) + bVar11 * '\b';
        uVar23 = uVar23 + 1;
        pgVar13 = local_98;
        uVar15 = local_38;
      } while (uVar23 != 0xf0);
      break;
    case 2:
      local_98 = ppu;
      if ((uVar14 >> 0xc & 1) != 0) {
        render_obj(ppu);
      }
      pgVar13 = local_98;
      if (((uint)*local_50 & 0x400) != 0) {
        uVar10._0_2_ = ppu->WININ;
        uVar10._2_2_ = ppu->WINOUT;
        auVar25 = pshuflw(ZEXT416(uVar10),ZEXT416(uVar10),5);
        auVar39 = ZEXT816(0x4040000040400);
        sVar54 = auVar39._6_2_;
        auVar43._0_12_ = auVar39._0_12_;
        auVar43._12_2_ = sVar54;
        auVar43._14_2_ = sVar54;
        sVar53 = auVar39._4_2_;
        auVar42._12_4_ = auVar43._12_4_;
        auVar42._0_10_ = auVar39._0_10_;
        auVar42._10_2_ = sVar53;
        auVar41._10_6_ = auVar42._10_6_;
        auVar41._8_2_ = sVar53;
        auVar41._0_8_ = 0x4040000040400;
        sVar52 = auVar39._2_2_;
        auVar40._8_8_ = auVar41._8_8_;
        auVar40._6_2_ = sVar52;
        auVar40._4_2_ = sVar52;
        auVar40._0_2_ = auVar39._0_2_;
        auVar40._2_2_ = auVar40._0_2_;
        auVar27._0_12_ = auVar25._0_12_;
        auVar27._12_2_ = auVar25._6_2_;
        auVar27._14_2_ = auVar25._6_2_;
        auVar26._12_4_ = auVar27._12_4_;
        auVar26._0_10_ = auVar25._0_10_;
        auVar26._10_2_ = auVar25._4_2_;
        auVar39._10_6_ = auVar26._10_6_;
        auVar39._0_8_ = auVar25._0_8_;
        auVar39._8_2_ = auVar25._4_2_;
        auVar28._8_8_ = auVar39._8_8_;
        auVar28._6_2_ = auVar25._2_2_;
        auVar28._4_2_ = auVar25._2_2_;
        auVar28._0_2_ = auVar25._0_2_;
        auVar28._2_2_ = auVar28._0_2_;
        auVar28 = auVar28 & auVar40;
        auVar25._0_2_ = -(ushort)(auVar28._0_2_ == auVar40._0_2_);
        auVar25._2_2_ = -(ushort)(auVar28._2_2_ == auVar40._0_2_);
        auVar25._4_2_ = -(ushort)(auVar28._4_2_ == sVar52);
        auVar25._6_2_ = -(ushort)(auVar28._6_2_ == sVar52);
        auVar25._8_2_ = -(ushort)(auVar28._8_2_ == sVar53);
        auVar25._10_2_ = -(ushort)(auVar28._10_2_ == sVar53);
        auVar25._12_2_ = -(ushort)(auVar28._12_2_ == sVar54);
        auVar25._14_2_ = -(ushort)(auVar28._14_2_ == sVar54);
        uVar5 = movmskps((int)local_50,auVar25);
        bVar11 = (byte)uVar5;
        render_bg_affine(local_98,ppu->bgbuf + 2,&ppu->BG2CNT,(_Bool)(bVar11 >> 3),
                         (_Bool)((bVar11 & 4) >> 2),(_Bool)((bVar11 & 2) >> 1),(_Bool)(bVar11 & 1),
                         &ppu->BG2X,&ppu->BG2Y,&ppu->BG2PA,in_stack_ffffffffffffff38,
                         &local_98->BG2PC,in_stack_ffffffffffffff48);
        ppu = pgVar13;
      }
      pgVar13 = local_98;
      if (((uint)*local_50 & 0x800) != 0) {
        uVar8._0_2_ = ppu->WININ;
        uVar8._2_2_ = ppu->WINOUT;
        auVar25 = pshuflw(ZEXT416(uVar8),ZEXT416(uVar8),5);
        auVar39 = ZEXT816(0x8080000080800);
        sVar54 = auVar39._6_2_;
        auVar47._0_12_ = auVar39._0_12_;
        auVar47._12_2_ = sVar54;
        auVar47._14_2_ = sVar54;
        sVar53 = auVar39._4_2_;
        auVar46._12_4_ = auVar47._12_4_;
        auVar46._0_10_ = auVar39._0_10_;
        auVar46._10_2_ = sVar53;
        auVar45._10_6_ = auVar46._10_6_;
        auVar45._8_2_ = sVar53;
        auVar45._0_8_ = 0x8080000080800;
        sVar52 = auVar39._2_2_;
        auVar44._8_8_ = auVar45._8_8_;
        auVar44._6_2_ = sVar52;
        auVar44._4_2_ = sVar52;
        auVar44._0_2_ = auVar39._0_2_;
        auVar44._2_2_ = auVar44._0_2_;
        auVar31._0_12_ = auVar25._0_12_;
        auVar31._12_2_ = auVar25._6_2_;
        auVar31._14_2_ = auVar25._6_2_;
        auVar30._12_4_ = auVar31._12_4_;
        auVar30._0_10_ = auVar25._0_10_;
        auVar30._10_2_ = auVar25._4_2_;
        auVar29._10_6_ = auVar30._10_6_;
        auVar29._0_8_ = auVar25._0_8_;
        auVar29._8_2_ = auVar25._4_2_;
        auVar32._8_8_ = auVar29._8_8_;
        auVar32._6_2_ = auVar25._2_2_;
        auVar32._4_2_ = auVar25._2_2_;
        auVar32._0_2_ = auVar25._0_2_;
        auVar32._2_2_ = auVar32._0_2_;
        auVar32 = auVar32 & auVar44;
        auVar33._0_2_ = -(ushort)(auVar32._0_2_ == auVar44._0_2_);
        auVar33._2_2_ = -(ushort)(auVar32._2_2_ == auVar44._0_2_);
        auVar33._4_2_ = -(ushort)(auVar32._4_2_ == sVar52);
        auVar33._6_2_ = -(ushort)(auVar32._6_2_ == sVar52);
        auVar33._8_2_ = -(ushort)(auVar32._8_2_ == sVar53);
        auVar33._10_2_ = -(ushort)(auVar32._10_2_ == sVar53);
        auVar33._12_2_ = -(ushort)(auVar32._12_2_ == sVar54);
        auVar33._14_2_ = -(ushort)(auVar32._14_2_ == sVar54);
        uVar5 = movmskps((int)local_50,auVar33);
        bVar11 = (byte)uVar5;
        render_bg_affine(local_98,ppu->bgbuf + 3,&ppu->BG3CNT,(_Bool)(bVar11 >> 3),
                         (_Bool)((bVar11 & 4) >> 2),(_Bool)((bVar11 & 2) >> 1),(_Bool)(bVar11 & 1),
                         &ppu->BG3X,&ppu->BG3Y,&ppu->BG3PA,in_stack_ffffffffffffff38,
                         &local_98->BG3PC,in_stack_ffffffffffffff48);
        ppu = pgVar13;
      }
      uVar23 = 0;
      dbg_line_drawn();
      refresh_background_priorities(ppu);
      uVar10 = (ppu->BLDALPHA).raw & 0x1f;
      if (0xf < (ushort)uVar10) {
        uVar10 = 0x10;
      }
      uVar8 = (ppu->BLDALPHA).raw >> 8 & 0x1f;
      if (0xf < (ushort)uVar8) {
        uVar8 = 0x10;
      }
      local_44 = (ppu->BLDY).raw & 0x1f;
      if (0xf < (ushort)local_44) {
        local_44 = 0x10;
      }
      bVar11 = (byte)((ppu->DISPCNT).raw >> 8);
      local_9c[0] = bVar11 & 1;
      local_9c[1] = bVar11 >> 1 & 1;
      local_9c[2] = bVar11 >> 2 & 1;
      local_9c[3] = bVar11 >> 3 & 1;
      bVar11 = (byte)(ppu->BLDCNT).raw;
      local_80[0] = bVar11 & 1;
      local_80[1] = bVar11 >> 1 & 1;
      local_80[2] = bVar11 >> 2 & 1;
      local_80[3] = bVar11 >> 3 & 1;
      local_7c = bVar11 >> 4 & 1;
      local_7b = bVar11 >> 5 & 1;
      bVar11 = (byte)((ppu->BLDCNT).raw >> 8);
      local_86[0] = bVar11 & 1;
      local_86[1] = bVar11 >> 1 & 1;
      local_86[2] = bVar11 >> 2 & 1;
      local_86[3] = bVar11 >> 3 & 1;
      local_82 = bVar11 >> 4 & 1;
      local_81 = bVar11 >> 5 & 1;
      local_7a = *(ushort *)ppu->pram;
      local_38 = (ulong)ppu->y;
      local_70 = ppu->bgbuf;
      local_40 = ppu->screen;
      pgVar13 = ppu;
      uVar15 = local_38;
      do {
        uVar14 = (ushort)uVar15;
        if ((byte)(pgVar13->WIN0H).raw < uVar23 || uVar23 < (pgVar13->WIN0H).raw >> 8) {
          bVar24 = false;
        }
        else {
          bVar24 = uVar14 <= ((pgVar13->WIN0V).raw & 0xff) && (pgVar13->WIN0V).raw >> 8 <= uVar14;
        }
        if ((byte)(pgVar13->WIN1H).raw < uVar23 || uVar23 < (pgVar13->WIN1H).raw >> 8) {
          bVar7 = false;
        }
        else {
          bVar7 = uVar14 <= ((pgVar13->WIN1V).raw & 0xff) && (pgVar13->WIN1V).raw >> 8 <= uVar14;
        }
        uVar14 = local_50->raw;
        bVar11 = (byte)(uVar14 >> 8);
        if ((bVar11 >> 5 & 1 & bVar24) == 1) {
          bVar11 = *(byte *)&pgVar13->WININ;
LAB_0011bbae:
          uVar18 = (ushort)(bVar11 >> 5);
        }
        else {
          if ((bVar11 >> 6 & 1 & bVar7) == 1) {
            uVar18 = (pgVar13->WININ).raw;
          }
          else {
            if (((short)uVar14 < 0 & pgVar13->obj_window[uVar23]) != 1) {
              uVar18 = 1;
              if ((uVar14 & 0x6000) != 0 && (bVar24 == false && bVar7 == false)) {
                bVar11 = *(byte *)&pgVar13->WINOUT;
                goto LAB_0011bbae;
              }
              goto LAB_0011bbf4;
            }
            uVar18 = (pgVar13->WINOUT).raw;
          }
          uVar18 = uVar18 >> 0xd;
        }
LAB_0011bbf4:
        uVar14 = (pgVar13->BLDCNT).raw;
        local_8c = uVar14 >> 6 & 3;
        local_a0 = uVar14 & 0xc0;
        local_58 = (black.raw & 0x1f) * local_44;
        local_5c = (black.raw >> 5 & 0x1f) * local_44;
        local_54 = (black.raw >> 10 & 0x1f) * local_44;
        local_64 = (white.raw & 0x1f) * local_44;
        local_68 = (white.raw >> 5 & 0x1f) * local_44;
        local_60 = (white.raw >> 10 & 0x1f) * local_44;
        iVar19 = 5;
        uVar15 = 3;
        local_78 = (ulong)local_8c;
        uVar20 = (uint)local_7a;
        uVar9 = uVar20;
        do {
          iVar4 = background_priorities[uVar15];
          lVar6 = (long)iVar19;
          if ((uVar18 & 1) == 0) {
            bVar11 = 0;
          }
          else {
            bVar11 = (local_a0 == 0x40 & local_86[lVar6] | (char)uVar14 < '\0') & local_80[iVar4];
          }
          uVar1 = ppu->bgbuf[iVar4][uVar23].raw;
          uVar12 = (uint)uVar1;
          bVar17 = -1 < (short)uVar1 & local_9c[iVar4];
          uVar21 = (uint)(byte)(0x10 - (char)local_44);
          if ((bVar17 == 1) && (bVar11 != 0)) {
            switch(local_8c) {
            case 0:
              ppu_hblank_cold_2();
              goto switchD_0011caa7_caseD_11ce5d;
            case 1:
              uVar9 = (uVar12 & 0x1f) * uVar10 + (uVar20 & 0x1f) * uVar8 >> 4;
              if (0x1e < uVar9) {
                uVar9 = 0x1f;
              }
              uVar12 = (uVar1 >> 5 & 0x1f) * uVar10 + (uVar20 >> 5 & 0x1f) * uVar8 >> 4;
              if (0x1e < uVar12) {
                uVar12 = 0x1f;
              }
              uVar20 = (uVar1 >> 10) * uVar10 + (uVar20 >> 10 & 0x1f) * uVar8;
              break;
            case 2:
              uVar9 = (uVar12 & 0x1f) * uVar21 + local_64 >> 4;
              if (0x1e < uVar9) {
                uVar9 = 0x1f;
              }
              uVar12 = (uVar1 >> 5 & 0x1f) * uVar21 + local_68 >> 4;
              if (0x1e < uVar12) {
                uVar12 = 0x1f;
              }
              uVar20 = (uVar1 >> 10) * uVar21 + local_60;
              break;
            case 3:
              uVar9 = (uVar12 & 0x1f) * uVar21 + local_58 >> 4;
              if (0x1e < uVar9) {
                uVar9 = 0x1f;
              }
              uVar12 = (uVar1 >> 5 & 0x1f) * uVar21 + local_5c >> 4;
              if (0x1e < uVar12) {
                uVar12 = 0x1f;
              }
              uVar20 = (uVar1 >> 10) * uVar21 + local_54;
            }
            uVar20 = uVar20 >> 4;
            if (0x1e < uVar20) {
              uVar20 = 0x1f;
            }
            uVar20 = uVar9 | uVar20 << 10 | uVar12 << 5;
LAB_0011be79:
            uVar9 = uVar20;
            uVar12 = (uint)uVar1;
            iVar19 = iVar4;
          }
          else {
            uVar12 = uVar20;
            uVar20 = (uint)uVar1;
            if (bVar17 != 0) goto LAB_0011be79;
          }
          uVar20 = uVar12;
          if (uVar15 == local_98->obj_priorities[uVar23]) {
            uVar1 = local_98->objbuf[uVar23].raw;
            bVar24 = -1 < (short)uVar1;
            uVar22 = (uint)uVar1;
            if (bVar24) {
              uVar9 = uVar22;
            }
            if (bVar24) {
              uVar20 = uVar22;
              iVar19 = 4;
            }
            if ((byte)(bVar24 & pgVar13->obj_alpha[uVar23] & ((char)uVar14 < '\0' | local_86[lVar6])
                      ) != 1) goto LAB_0011c044;
            switch(local_8c) {
            case 0:
              goto switchD_0011beeb_caseD_11ce67;
            default:
              uVar9 = (uVar1 & 0x1f) * uVar10 + (uVar12 & 0x1f) * uVar8 >> 4;
              if (0x1e < uVar9) {
                uVar9 = 0x1f;
              }
              uVar20 = (uVar1 >> 5 & 0x1f) * uVar10 + (uVar12 >> 5 & 0x1f) * uVar8 >> 4;
              if (0x1e < uVar20) {
                uVar20 = 0x1f;
              }
              uVar21 = (uVar1 >> 10) * uVar10 + (uVar12 >> 10 & 0x1f) * uVar8 >> 4;
              if (0x1e < uVar21) {
                uVar21 = 0x1f;
              }
              uVar9 = uVar9 | uVar21 << 10;
              goto LAB_0011c03c;
            case 2:
              uVar9 = (uVar1 & 0x1f) * uVar21 + local_64 >> 4;
              if (0x1e < uVar9) {
                uVar9 = 0x1f;
              }
              uVar20 = (uVar1 >> 5 & 0x1f) * uVar21 + local_68 >> 4;
              if (0x1e < uVar20) {
                uVar20 = 0x1f;
              }
              uVar21 = (uVar1 >> 10) * uVar21 + local_60;
              break;
            case 3:
              uVar9 = (uVar22 & 0x1f) * uVar21 + local_58 >> 4;
              if (0x1e < uVar9) {
                uVar9 = 0x1f;
              }
              uVar20 = (uVar1 >> 5 & 0x1f) * uVar21 + local_5c >> 4;
              if (0x1e < uVar20) {
                uVar20 = 0x1f;
              }
              uVar21 = (uVar1 >> 10) * uVar21 + local_54;
            }
            uVar21 = uVar21 >> 4;
            if (0x1e < uVar21) {
              uVar21 = 0x1f;
            }
            uVar9 = uVar9 | uVar21 << 10;
LAB_0011c03c:
            uVar9 = uVar9 | uVar20 << 5;
            iVar19 = 4;
            uVar20 = (uint)uVar1;
          }
LAB_0011c044:
          bVar24 = uVar15 != 0;
          uVar15 = uVar15 - 1;
        } while (bVar24);
        local_40[local_38][uVar23].a = 0xff;
        local_40[local_38][uVar23].r = ((byte)uVar9 & 7) + (byte)uVar9 * '\b';
        bVar11 = (byte)((uVar9 & 0xffff) >> 5);
        local_40[local_38][uVar23].g = (bVar11 & 7) + bVar11 * '\b';
        bVar11 = (byte)((uVar9 & 0xffff) >> 10);
        local_40[local_38][uVar23].b = (bVar11 & 7) + bVar11 * '\b';
        uVar23 = uVar23 + 1;
        pgVar13 = local_98;
        uVar15 = local_38;
      } while (uVar23 != 0xf0);
      break;
    case 3:
      local_98 = ppu;
      render_line_mode3(ppu);
      return;
    case 4:
      local_98 = ppu;
      render_line_mode4(ppu);
      return;
    default:
      goto LAB_0011ce76;
    }
  }
  return;
switchD_0011caa7_caseD_11ce5d:
  ppu_hblank_cold_4();
switchD_0011b48e_caseD_11ce62:
  ppu_hblank_cold_6();
switchD_0011beeb_caseD_11ce67:
  ppu_hblank_cold_1();
switchD_0011cc5b_caseD_11ce6c:
  ppu_hblank_cold_3();
switchD_0011b642_caseD_11ce71:
  ppu_hblank_cold_5();
LAB_0011ce76:
  pDVar16 = local_50;
  ppu_hblank_cold_7();
  dma_start_trigger(VBlank);
  if ((pDVar16[0xfb33].raw & 8) != 0) {
    request_interrupt(IRQ_VBLANK);
  }
  *(byte *)(pDVar16 + 0xfb33) = (byte)pDVar16[0xfb33].raw | 1;
  render_screen((color_t (*) [160] [240])((long)pDVar16 + 2));
  return;
}

Assistant:

void ppu_hblank(gba_ppu_t* ppu) {
    if (!is_vblank(ppu)) {
        dma_start_trigger(HBlank);
    }
    if (ppu->DISPSTAT.hblank_irq_enable) {
        request_interrupt(IRQ_HBLANK);
    }
    ppu->DISPSTAT.hblank = true;
    if (ppu->y < GBA_SCREEN_Y && !ppu->DISPCNT.forced_blank) { // i.e. not VBlank
        render_line(ppu);
    }
}